

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
* __thiscall
argstest::Command::GetDescription_abi_cxx11_
          (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           *__return_storage_ptr__,Command *this,HelpParams *params,uint indent)

{
  pointer ppBVar1;
  Base *pBVar2;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *p_Var3;
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
  *pvVar4;
  HelpParams *params_00;
  Command *pCVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *p_Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *progline;
  pointer pbVar10;
  pointer ppBVar11;
  ostringstream s;
  uint local_1e8;
  char local_1e1;
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
  *local_1e0;
  HelpParams *local_1d8;
  Command *local_1d0;
  undefined1 local_1c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined1 local_190 [16];
  char *local_180;
  char local_170 [56];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8 = indent;
  local_1e0 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
               *)__return_storage_ptr__;
  local_1d8 = params;
  UpdateSubparserHelp(this,params);
  iVar7 = (*(this->super_Group).super_Base._vptr_Base[2])(this);
  params_00 = local_1d8;
  iVar8 = 0;
  local_1d0 = this;
  if ((char)iVar7 == '\0') {
    if (local_1d8->showCommandFullHelp == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8._M_local_buf);
      GetCommandProgramLine_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1c8,this,params_00);
      if (local_1c8._0_8_ != local_1c8._8_8_) {
        bVar6 = true;
        pbVar10 = (pointer)local_1c8._0_8_;
        do {
          if (!bVar6) {
            local_1e1 = ' ';
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8._M_local_buf,&local_1e1,1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8._M_local_buf,(pbVar10->_M_dataplus)._M_p,
                     pbVar10->_M_string_length);
          pbVar10 = pbVar10 + 1;
          bVar6 = false;
        } while (pbVar10 != (pointer)local_1c8._8_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1c8);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::__cxx11::string,char_const(&)[1],unsigned_int_const&>
                (local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                 (char (*) [1])0x1d220c,&local_1e8);
      this = local_1d0;
      if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_local_buf);
      std::ios_base::~ios_base(local_138);
    }
    else {
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int_const&>
                (local_1e0,&this->name,&this->help,&local_1e8);
    }
    iVar8 = 1;
    if ((local_1d8->showCommandChildren == false) && (local_1d8->showCommandFullHelp != true)) {
      return (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)local_1e0;
    }
  }
  if ((local_1d8->showCommandFullHelp == true) &&
     (iVar7 = (*(this->super_Group).super_Base._vptr_Base[2])(this), pvVar4 = local_1e0,
     (char)iVar7 == '\0')) {
    local_1a8._M_allocated_capacity._0_4_ = local_1e8 + iVar8;
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
    ::emplace_back<char_const(&)[1],char_const(&)[1],unsigned_int>
              (local_1e0,(char (*) [1])0x1d220c,(char (*) [1])0x1d220c,
               (uint *)&local_1a8._M_allocated_capacity);
    local_1a8._M_allocated_capacity._0_4_ = local_1e8 + iVar8;
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::__cxx11::string_const&,char_const(&)[1],unsigned_int>
              (pvVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &(&this->help)[(this->description)._M_string_length != 0]._M_dataplus,
               (char (*) [1])0x1d220c,(uint *)&local_1a8._M_allocated_capacity);
    local_1a8._M_allocated_capacity._0_4_ = local_1e8 + iVar8;
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
    ::emplace_back<char_const(&)[1],char_const(&)[1],unsigned_int>
              (pvVar4,(char (*) [1])0x1d220c,(char (*) [1])0x1d220c,
               (uint *)&local_1a8._M_allocated_capacity);
  }
  ppBVar11 = (this->super_Group).children.
             super__Vector_base<argstest::Base_*,_std::allocator<argstest::Base_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppBVar1 = (this->super_Group).children.
            super__Vector_base<argstest::Base_*,_std::allocator<argstest::Base_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppBVar11 != ppBVar1) {
    do {
      pBVar2 = *ppBVar11;
      if ((pBVar2->options & HiddenFromDescription) == None) {
        (*pBVar2->_vptr_Base[4])(&local_1a8,pBVar2,local_1d8,(ulong)(local_1e8 + iVar8));
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
        ::
        _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>>>
                  (local_1e0,*(undefined8 *)(local_1e0 + 8),
                   CONCAT44(local_1a8._M_allocated_capacity._4_4_,
                            local_1a8._M_allocated_capacity._0_4_),local_1a8._8_8_);
        std::
        vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)&local_1a8);
      }
      ppBVar11 = ppBVar11 + 1;
    } while (ppBVar11 != ppBVar1);
  }
  p_Var9 = &((local_1d0->subparserDescription).
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ;
  p_Var3 = &((local_1d0->subparserDescription).
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ;
  if (p_Var9 != p_Var3) {
    do {
      std::
      _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                     *)&local_1a8,p_Var9);
      local_1a8._M_allocated_capacity._0_4_ =
           local_1a8._M_allocated_capacity._0_4_ + local_1e8 + iVar8;
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>
                (local_1e0,
                 (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)&local_1a8);
      if (local_180 != local_170) {
        operator_delete(local_180);
      }
      if ((undefined1 *)local_1a8._8_8_ != local_190) {
        operator_delete((void *)local_1a8._8_8_);
      }
      p_Var9 = p_Var9 + 1;
    } while (p_Var9 != p_Var3);
  }
  pCVar5 = local_1d0;
  if ((local_1d8->showCommandFullHelp != false) &&
     (iVar7 = (*(local_1d0->super_Group).super_Base._vptr_Base[2])(local_1d0), (char)iVar7 == '\0'))
  {
    local_1a8._M_allocated_capacity._0_4_ = local_1e8 + iVar8;
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
    ::emplace_back<char_const(&)[1],char_const(&)[1],unsigned_int>
              (local_1e0,(char (*) [1])0x1d220c,(char (*) [1])0x1d220c,
               (uint *)&local_1a8._M_allocated_capacity);
    pvVar4 = local_1e0;
    if ((pCVar5->epilog)._M_string_length != 0) {
      local_1a8._M_allocated_capacity._0_4_ = local_1e8 + iVar8;
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::__cxx11::string_const&,char_const(&)[1],unsigned_int>
                (local_1e0,&pCVar5->epilog,(char (*) [1])0x1d220c,
                 (uint *)&local_1a8._M_allocated_capacity);
      local_1a8._M_allocated_capacity._0_4_ = iVar8 + local_1e8;
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
      ::emplace_back<char_const(&)[1],char_const(&)[1],unsigned_int>
                (pvVar4,(char (*) [1])0x1d220c,(char (*) [1])0x1d220c,
                 (uint *)&local_1a8._M_allocated_capacity);
    }
  }
  return (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)local_1e0;
}

Assistant:

virtual std::vector<std::tuple<std::string, std::string, unsigned>> GetDescription(const HelpParams &params, const unsigned int indent) const override
            {
                std::vector<std::tuple<std::string, std::string, unsigned>> descriptions;
                unsigned addindent = 0;

                UpdateSubparserHelp(params);

                if (!Matched())
                {
                    if (params.showCommandFullHelp)
                    {
                        std::ostringstream s;
                        bool empty = true;
                        for (const auto &progline: GetCommandProgramLine(params))
                        {
                            if (!empty)
                            {
                                s << ' ';
                            }
                            else
                            {
                                empty = false;
                            }

                            s << progline;
                        }

                        descriptions.emplace_back(s.str(), "", indent);
                    }
                    else
                    {
                        descriptions.emplace_back(Name(), help, indent);
                    }

                    if (!params.showCommandChildren && !params.showCommandFullHelp)
                    {
                        return descriptions;
                    }

                    addindent = 1;
                }

                if (params.showCommandFullHelp && !Matched())
                {
                    descriptions.emplace_back("", "", indent + addindent);
                    descriptions.emplace_back(Description().empty() ? Help() : Description(), "", indent + addindent);
                    descriptions.emplace_back("", "", indent + addindent);
                }

                for (Base *child: Children())
                {
                    if ((child->GetOptions() & Options::HiddenFromDescription) != Options::None)
                    {
                        continue;
                    }

                    auto groupDescriptions = child->GetDescription(params, indent + addindent);
                    descriptions.insert(
                                        std::end(descriptions),
                                        std::make_move_iterator(std::begin(groupDescriptions)),
                                        std::make_move_iterator(std::end(groupDescriptions)));
                }

                for (auto childDescription: subparserDescription)
                {
                    std::get<2>(childDescription) += indent + addindent;
                    descriptions.push_back(std::move(childDescription));
                }

                if (params.showCommandFullHelp && !Matched())
                {
                    descriptions.emplace_back("", "", indent + addindent);
                    if (!Epilog().empty())
                    {
                        descriptions.emplace_back(Epilog(), "", indent + addindent);
                        descriptions.emplace_back("", "", indent + addindent);
                    }
                }

                return descriptions;
            }